

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void apprun_env_item_free(apprun_env_item_t *item)

{
  if (item != (apprun_env_item_t *)0x0) {
    if (item->name != (char *)0x0) {
      free(item->name);
    }
    if (item->current_value != (char *)0x0) {
      free(item->current_value);
    }
    if (item->original_value != (char *)0x0) {
      free(item->original_value);
    }
    if (item->startup_value != (char *)0x0) {
      free(item->startup_value);
    }
    free(item);
    return;
  }
  return;
}

Assistant:

void apprun_env_item_free(apprun_env_item_t *item) {
    if (item == NULL)
        return;

    if (item->name != NULL)
        free(item->name);

    if (item->current_value != NULL)
        free(item->current_value);

    if (item->original_value != NULL)
        free(item->original_value);

    if (item->startup_value != NULL)
        free(item->startup_value);

    free(item);
}